

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits>::
get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_it,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_it,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_last)

{
  char *pcVar1;
  iterator __position;
  char *pcVar2;
  unsigned_long uVar3;
  unsigned_long local_38;
  
  pcVar1 = *(char **)(this + 0x10);
  if (query_it._M_current != query_last._M_current && pcVar1 != item_it._M_current) {
    pcVar2 = item_it._M_current + 1;
    uVar3 = (long)item_it._M_current - (long)item_first._M_current;
    do {
      if (pcVar2[-1] == *query_it._M_current) {
        __position._M_current =
             (posns->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (posns->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_38 = uVar3;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(posns,__position,&local_38);
        }
        else {
          *__position._M_current = uVar3;
          (posns->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        query_it._M_current = query_it._M_current + 1;
      }
      if (pcVar2 == pcVar1) {
        return;
      }
      pcVar2 = pcVar2 + 1;
      uVar3 = uVar3 + 1;
    } while (query_it._M_current != query_last._M_current);
  }
  return;
}

Assistant:

void get_match_positions_greedy(std::vector<std::size_t>& posns,
                                  InputIt1 const item_first, InputIt1 item_it,
                                  InputIt2 query_it,
                                  InputIt2 const query_last) const {
    auto const item_last = item_.cend();
    while (item_it != item_last && query_it != query_last) {
      if (*item_it == *query_it) {
        ++query_it;
        posns.push_back(item_it - item_first);
      }
      ++item_it;
    }
  }